

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_FabConv.cpp
# Opt level: O2

void amrex::RealDescriptor::convertFromNativeFloatFormat
               (ostream *os,Long nitems,float *in,RealDescriptor *od)

{
  bool bVar1;
  void *out;
  RealDescriptor *ord;
  RealDescriptor *ird;
  Long LVar2;
  long nitems_00;
  float *in_00;
  IntDescriptor *in_stack_ffffffffffffff18;
  int in_stack_ffffffffffffff20;
  allocator local_d9;
  Long local_d8;
  float *local_d0;
  long local_c8;
  ostream *local_c0;
  string local_b8;
  StreamRetry sr;
  
  local_c8 = (long)writeBufferSize;
  if (nitems <= writeBufferSize) {
    local_c8 = nitems;
  }
  local_d8 = nitems;
  local_d0 = in;
  std::__cxx11::string::string((string *)&local_b8,"RD_cFNF",&local_d9);
  StreamRetry::StreamRetry(&sr,os,&local_b8,4);
  std::__cxx11::string::~string((string *)&local_b8);
  local_c0 = os;
  while( true ) {
    bVar1 = StreamRetry::TryOutput(&sr);
    if (!bVar1) break;
    out = operator_new__((*(od->fr).super_vector<long,_std::allocator<long>_>.
                           super__Vector_base<long,_std::allocator<long>_>._M_impl.
                           super__Vector_impl_data._M_start * 0x20000000 + 0xe0000000 >> 0x20) *
                         local_c8);
    in_00 = local_d0;
    for (LVar2 = local_d8; 0 < LVar2; LVar2 = LVar2 - nitems_00) {
      nitems_00 = (long)writeBufferSize;
      if (LVar2 < writeBufferSize) {
        nitems_00 = LVar2;
      }
      ord = FPC::Native32RealDescriptor();
      ird = (RealDescriptor *)FPC::NativeLongDescriptor();
      PD_convert(out,in_00,nitems_00,(int)od,ord,ird,in_stack_ffffffffffffff18,
                 in_stack_ffffffffffffff20);
      std::ostream::write((char *)local_c0,(long)out);
      in_00 = in_00 + nitems_00;
    }
    operator_delete__(out);
  }
  StreamRetry::~StreamRetry(&sr);
  return;
}

Assistant:

void
RealDescriptor::convertFromNativeFloatFormat (std::ostream&         os,
                                              Long                  nitems,
                                              const float*          in,
                                              const RealDescriptor& od)
{
//  BL_PROFILE("RD:convertFromNativeFloatFormat");
  Long nitemsSave(nitems);
  Long buffSize(std::min(Long(writeBufferSize), nitems));
  const float *inSave(in);
  amrex::StreamRetry sr(os, "RD_cFNF", 4);

  while(sr.TryOutput()) {
    nitems = nitemsSave;
    in = inSave;

    char *bufr = new char[buffSize * od.numBytes()];

    while (nitems > 0)
    {
        Long put = std::min(static_cast<Long>(writeBufferSize), nitems);
        PD_convert(bufr,
                   in,
                   put,
                   0,
                   od,
                   FPC::Native32RealDescriptor(),
                   FPC::NativeLongDescriptor());
        os.write(bufr, od.numBytes()*put);
        nitems -= put;
        in     += put;
    }

    delete [] bufr;
  }
}